

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItemsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target)

{
  int iVar1;
  Type TVar2;
  uint32 value;
  UnknownField *this;
  uint8 *puVar3;
  UnknownField *field;
  uint8 *puStack_58;
  int i;
  uint8 *target_local;
  UnknownFieldSet *unknown_fields_local;
  
  field._4_4_ = 0;
  puStack_58 = target;
  while( true ) {
    iVar1 = UnknownFieldSet::field_count(unknown_fields);
    if (iVar1 <= field._4_4_) break;
    this = UnknownFieldSet::field(unknown_fields,field._4_4_);
    TVar2 = UnknownField::type(this);
    if (TVar2 == TYPE_LENGTH_DELIMITED) {
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0xb,puStack_58);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0x10,puVar3);
      value = UnknownField::number(this);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(value,puVar3);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0x1a,puVar3);
      puVar3 = UnknownField::SerializeLengthDelimitedNoTagToArray(this,puVar3);
      puStack_58 = io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar3);
    }
    field._4_4_ = field._4_4_ + 1;
  }
  return puStack_58;
}

Assistant:

uint8* WireFormat::SerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields,
    uint8* target) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target = io::CodedOutputStream::WriteVarint32ToArray(
          field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);
      target = field.SerializeLengthDelimitedNoTagToArray(target);

      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}